

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O2

CURLcode rtp_write_body_junk(Curl_easy *data,char *buf,size_t blen)

{
  long lVar1;
  long lVar2;
  CURLcode CVar3;
  size_t sVar4;
  
  if (((((data->req).headerline != 0) && ((*(byte *)((long)&data->conn->proto + 0x34) & 1) == 0)) &&
      (lVar1 = (data->req).size, -1 < lVar1)) &&
     (lVar2 = (data->req).bytecount, sVar4 = lVar1 - lVar2, sVar4 != 0 && lVar2 <= lVar1)) {
    if ((long)sVar4 < (long)blen) {
      blen = sVar4;
    }
    CVar3 = Curl_client_write(data,1,buf,blen);
    return CVar3;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode rtp_write_body_junk(struct Curl_easy *data,
                                    const char *buf,
                                    size_t blen)
{
  struct rtsp_conn *rtspc = &(data->conn->proto.rtspc);
  curl_off_t body_remain;
  bool in_body;

  in_body = (data->req.headerline && !rtspc->in_header) &&
            (data->req.size >= 0) &&
            (data->req.bytecount < data->req.size);
  body_remain = in_body? (data->req.size - data->req.bytecount) : 0;
  DEBUGASSERT(body_remain >= 0);
  if(body_remain) {
    if((curl_off_t)blen > body_remain)
      blen = (size_t)body_remain;
    return Curl_client_write(data, CLIENTWRITE_BODY, (char *)buf, blen);
  }
  return CURLE_OK;
}